

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasLazyFields(Descriptor *descriptor,Options *options)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Descriptor *in_RSI;
  Descriptor *in_RDI;
  int idx_1;
  int idx;
  int field_idx;
  Options *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_24;
  int iVar4;
  int index;
  
  iVar4 = 0;
  while( true ) {
    index = iVar4;
    iVar2 = Descriptor::field_count(in_RDI);
    if (iVar2 <= iVar4) {
      iVar4 = 0;
      while( true ) {
        iVar2 = iVar4;
        iVar3 = Descriptor::extension_count(in_RDI);
        if (iVar3 <= iVar4) {
          local_24 = 0;
          while( true ) {
            iVar4 = local_24;
            iVar3 = Descriptor::nested_type_count(in_RDI);
            if (iVar3 <= iVar4) {
              return false;
            }
            Descriptor::nested_type(in_RDI,local_24);
            bVar1 = HasLazyFields(in_RSI,(Options *)CONCAT44(index,iVar2));
            if (bVar1) break;
            local_24 = local_24 + 1;
          }
          return true;
        }
        Descriptor::extension(in_RDI,iVar2);
        bVar1 = IsLazy((FieldDescriptor *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
        if (bVar1) break;
        iVar4 = iVar2 + 1;
      }
      return true;
    }
    Descriptor::field(in_RDI,index);
    bVar1 = IsLazy((FieldDescriptor *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
    if (bVar1) break;
    iVar4 = index + 1;
  }
  return true;
}

Assistant:

static bool HasLazyFields(const Descriptor* descriptor,
                          const Options& options) {
  for (int field_idx = 0; field_idx < descriptor->field_count(); field_idx++) {
    if (IsLazy(descriptor->field(field_idx), options)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->extension_count(); idx++) {
    if (IsLazy(descriptor->extension(idx), options)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->nested_type_count(); idx++) {
    if (HasLazyFields(descriptor->nested_type(idx), options)) {
      return true;
    }
  }
  return false;
}